

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O0

ShaderCodeVariableDescX * __thiscall
Diligent::ShaderCodeVariableDescX::operator=
          (ShaderCodeVariableDescX *this,ShaderCodeVariableDescX *RHS)

{
  char *pcVar1;
  ShaderCodeVariableDescX *pSVar2;
  ShaderCodeVariableDescX *RHS_local;
  ShaderCodeVariableDescX *this_local;
  
  memcpy(this,RHS,0x28);
  std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ::operator=(&this->Members,&RHS->Members);
  std::__cxx11::string::operator=((string *)&this->NameCopy,(string *)&RHS->NameCopy);
  std::__cxx11::string::operator=((string *)&this->TypeNameCopy,(string *)&RHS->TypeNameCopy);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  (this->super_ShaderCodeVariableDesc).Name = pcVar1;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  (this->super_ShaderCodeVariableDesc).TypeName = pcVar1;
  pSVar2 = std::
           vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ::data(&this->Members);
  (this->super_ShaderCodeVariableDesc).pMembers = &pSVar2->super_ShaderCodeVariableDesc;
  return this;
}

Assistant:

ShaderCodeVariableDescX& operator=(ShaderCodeVariableDescX&& RHS) noexcept
    {
        static_cast<ShaderCodeVariableDesc&>(*this) = RHS;

        Members      = std::move(RHS.Members);
        NameCopy     = std::move(RHS.NameCopy);
        TypeNameCopy = std::move(RHS.TypeNameCopy);

        Name     = NameCopy.c_str();
        TypeName = TypeNameCopy.c_str();
        pMembers = Members.data();

        return *this;
    }